

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall
Centaurus::DFA<char>::filter_nodes(DFA<char> *this,vector<bool,_std::allocator<bool>_> *mask)

{
  pointer *this_00;
  const_reference cVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  reference pvVar6;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *pvVar7;
  reference pNVar8;
  reference pvVar9;
  reference this_01;
  NFATransition<char> *t_1;
  iterator __end0_2;
  iterator __begin0_2;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range3
  ;
  DFAState<char> *n;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *__range2;
  NFATransition<char> *t;
  iterator __end0;
  iterator __begin0;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> *__range4
  ;
  vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_> filtered;
  int local_60;
  int dest_index;
  int src_index;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> index_map;
  vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> nodes;
  vector<bool,_std::allocator<bool>_> *mask_local;
  DFA<char> *this_local;
  
  std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::vector
            ((vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *)
             &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::size
                    (&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states);
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,sVar4,&local_49);
  std::allocator<int>::~allocator(&local_49);
  sVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::size
                    (&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states);
  sVar5 = std::vector<bool,_std::allocator<bool>_>::size(mask);
  if (sVar4 != sVar5) {
    __assert_fail("m_states.size() == mask.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/DFA.hpp"
                  ,0xe9,
                  "void Centaurus::DFA<char>::filter_nodes(const std::vector<bool> &) [TCHAR = char]"
                 );
  }
  filtered.
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (local_60 = 0;
      sVar4 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
              size(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states),
      (ulong)(long)local_60 < sVar4; local_60 = local_60 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)local_60);
    if (cVar1) {
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::vector((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                *)&__range4);
      pvVar6 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
               at(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(long)local_60);
      pvVar7 = NFABaseState<char,_Centaurus::IndexVector>::get_transitions
                         (&pvVar6->super_NFABaseState<char,_Centaurus::IndexVector>);
      __end0 = std::
               vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ::begin(pvVar7);
      t = (NFATransition<char> *)
          std::
          vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
          end(pvVar7);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                                         *)&t), bVar2) {
        pNVar8 = __gnu_cxx::
                 __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                 ::operator*(&__end0);
        iVar3 = NFATransition<char>::dest(pNVar8);
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,(long)iVar3);
        if (cVar1) {
          std::
          vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
          push_back((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                     *)&__range4,pNVar8);
        }
        __gnu_cxx::
        __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
        ::operator++(&__end0);
      }
      pvVar6 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
               at(&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,(long)local_60);
      std::vector<Centaurus::DFAState<char>,std::allocator<Centaurus::DFAState<char>>>::
      emplace_back<Centaurus::DFAState<char>&,std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>>
                ((vector<Centaurus::DFAState<char>,std::allocator<Centaurus::DFAState<char>>> *)
                 &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,pvVar6,
                 (vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                  *)&__range4);
      iVar3 = filtered.
              super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_60);
      *pvVar9 = iVar3;
      filtered.
      super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           filtered.
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
      ::~vector((vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                 *)&__range4);
    }
    else {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)local_60);
      *pvVar9 = -1;
    }
  }
  this_00 = &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  __end0_1 = std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::
             begin((vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *
                   )this_00);
  n = (DFAState<char> *)
      std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::end
                ((vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *)
                 this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<Centaurus::DFAState<char>_*,_std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>_>
                             *)&n), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<Centaurus::DFAState<char>_*,_std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>_>
              ::operator*(&__end0_1);
    pvVar7 = NFABaseState<char,_Centaurus::IndexVector>::get_transitions
                       (&this_01->super_NFABaseState<char,_Centaurus::IndexVector>);
    __end0_2 = std::
               vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
               ::begin(pvVar7);
    t_1 = (NFATransition<char> *)
          std::
          vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>::
          end(pvVar7);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_2,
                              (__normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
                               *)&t_1), bVar2) {
      pNVar8 = __gnu_cxx::
               __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
               ::operator*(&__end0_2);
      iVar3 = NFATransition<char>::dest(pNVar8);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_48,(long)iVar3);
      NFATransition<char>::dest(pNVar8,*pvVar9);
      __gnu_cxx::
      __normal_iterator<Centaurus::NFATransition<char>_*,_std::vector<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>_>
      ::operator++(&__end0_2);
    }
    __gnu_cxx::
    __normal_iterator<Centaurus::DFAState<char>_*,_std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>_>
    ::operator++(&__end0_1);
  }
  std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::operator=
            (&(this->super_NFABase<Centaurus::DFAState<char>_>).m_states,
             (vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *)
             &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::~vector
            ((vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *)
             &index_map.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void filter_nodes(const std::vector<bool>& mask)
    {
        std::vector<DFAState<TCHAR> > nodes;
        std::vector<int> index_map(m_states.size());

        assert(m_states.size() == mask.size());

        for (int src_index = 0, dest_index = 0; src_index < m_states.size(); src_index++)
        {
            if (mask[src_index])
            {
                std::vector<DFATransition<TCHAR> > filtered;
                for (const auto& t : m_states.at(src_index).get_transitions())
                {
                    if (mask[t.dest()])
                    {
                        filtered.push_back(t);
                    }
                }
                nodes.emplace_back(m_states.at(src_index), std::move(filtered));
                index_map[src_index] = dest_index;
                dest_index++;
            }
            else
            {
                index_map[src_index] = -1;
            }
        }

        for (auto& n : nodes)
        {
            for (auto& t : n.get_transitions())
            {
                t.dest(index_map[t.dest()]);
            }
        }
        m_states = std::move(nodes);
    }